

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O2

int epoll_ctl_mod_fail(int epfd,int op,int fd,epoll_event *event)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = 0;
  if (op == 3) {
    piVar2 = __errno_location();
    *piVar2 = 0x1c;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int epoll_ctl_mod_fail(int epfd, int op, int fd, struct epoll_event *event)
{

	(void)epfd;
	(void)fd;
	(void)event;

	if (op == EPOLL_CTL_MOD) {
		errno = ENOSPC;
		return -1;
	} else {
		return 0;
	}
}